

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

char * mp_encode_binl(char *data,uint32_t len)

{
  long lVar1;
  
  if (len < 0x100) {
    *data = -0x3c;
    data[1] = (char)len;
    lVar1 = 2;
  }
  else if (len < 0x10000) {
    *data = -0x3b;
    *(ushort *)(data + 1) = (ushort)len << 8 | (ushort)len >> 8;
    lVar1 = 3;
  }
  else {
    *data = -0x3a;
    *(uint32_t *)(data + 1) =
         len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    lVar1 = 5;
  }
  return data + lVar1;
}

Assistant:

MP_IMPL char *
mp_encode_binl(char *data, uint32_t len)
{
	if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xc4);
		return mp_store_u8(data, len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xc5);
		return mp_store_u16(data, len);
	} else {
		data = mp_store_u8(data, 0xc6);
		return mp_store_u32(data, len);
	}
}